

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckFeatures.cpp
# Opt level: O1

bool __thiscall
GdlRenderer::PreCompileFeatures
          (GdlRenderer *this,GrcManager *pcman,GrcFont *param_2,uint32_t *pfxdFeatVersion)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color __val;
  GdlFeatureDefn *pGVar2;
  pointer pcVar3;
  char cVar4;
  char cVar5;
  pointer ppGVar6;
  _Base_ptr p_Var7;
  long *plVar8;
  _Rb_tree_color _Var9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  long *plVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  uint nID;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vnIDs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> stnID;
  string __str;
  string __str_1;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> setID;
  _Rb_tree_color local_1dc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d8;
  ulong local_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  ulong local_188;
  long local_180;
  long lStack_178;
  GdlRenderer *local_170;
  GdlFeatureDefn *local_168;
  uint *local_160;
  undefined8 local_158;
  uint local_150;
  uint uStack_14c;
  string local_140;
  GrcManager *local_120;
  ulong local_118;
  uint32_t *local_110;
  GdlObject *local_108;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  *pfxdFeatVersion = 0x10000;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b8 = 0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppGVar6 = (this->m_vpfeat).super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_170 = this;
  local_120 = pcman;
  local_110 = pfxdFeatVersion;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->m_vpfeat).super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>.
      _M_impl.super__Vector_impl_data._M_finish == ppGVar6) {
    uVar14 = 0;
  }
  else {
    uVar13 = 0;
    do {
      pGVar2 = ppGVar6[uVar13];
      local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_118 = uVar13;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&local_1d8,&pGVar2->m_vnIDs);
      local_168 = pGVar2;
      if (local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_108 = &(pGVar2->super_GdlDefn).super_GdlObject;
        uVar14 = 0;
        do {
          __val = local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar14];
          p_Var7 = &local_60._M_impl.super__Rb_tree_header._M_header;
          for (p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
              (_Rb_tree_header *)p_Var10 != (_Rb_tree_header *)0x0;
              p_Var10 = (&p_Var10->_M_left)[bVar15]) {
            bVar15 = (_Rb_tree_color)*(size_t *)(p_Var10 + 1) < __val;
            if (!bVar15) {
              p_Var7 = p_Var10;
            }
          }
          p_Var1 = &local_60._M_impl.super__Rb_tree_header;
          p_Var11 = p_Var1;
          if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
             (p_Var11 = (_Rb_tree_header *)p_Var7,
             __val < (_Rb_tree_color)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
            p_Var11 = p_Var1;
          }
          local_1dc = __val;
          if (p_Var11 == p_Var1) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)&local_60,&local_1dc);
          }
          else {
            if (__val < 0x1000000) {
              cVar5 = '\x01';
              if (9 < __val) {
                _Var9 = __val;
                cVar4 = '\x04';
                do {
                  cVar5 = cVar4;
                  if (_Var9 < 100) {
                    cVar5 = cVar5 + -2;
                    goto LAB_001352ae;
                  }
                  if (_Var9 < 1000) {
                    cVar5 = cVar5 + -1;
                    goto LAB_001352ae;
                  }
                  if (_Var9 < 10000) goto LAB_001352ae;
                  bVar15 = 99999 < _Var9;
                  _Var9 = _Var9 / 10000;
                  cVar4 = cVar5 + '\x04';
                } while (bVar15);
                cVar5 = cVar5 + '\x01';
              }
LAB_001352ae:
              local_1b0 = &local_1a0;
              std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar5);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        ((char *)local_1b0,(uint)local_1a8,__val);
            }
            else {
              local_160 = &local_150;
              local_150 = __val >> 0x18 | (__val & 0xff0000) >> 8 | (__val & 0xff00) << 8 |
                          __val << 0x18;
              local_158 = 4;
              uStack_14c = uStack_14c & 0xffffff00;
              plVar8 = (long *)std::__cxx11::string::insert((ulong)&local_160,0,'\x01');
              local_190 = &local_180;
              plVar12 = plVar8 + 2;
              if ((long *)*plVar8 == plVar12) {
                local_180 = *plVar12;
                lStack_178 = plVar8[3];
              }
              else {
                local_180 = *plVar12;
                local_190 = (long *)*plVar8;
              }
              local_188 = plVar8[1];
              *plVar8 = (long)plVar12;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                         ((ulong)&local_190,local_188,0,'\x01');
              plVar12 = plVar8 + 2;
              if ((long *)*plVar8 == plVar12) {
                local_1a0 = *plVar12;
                lStack_198 = plVar8[3];
                local_1b0 = &local_1a0;
              }
              else {
                local_1a0 = *plVar12;
                local_1b0 = (long *)*plVar8;
              }
              local_1a8 = plVar8[1];
              *plVar8 = (long)plVar12;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
            }
            if (0xffffff < __val) {
              if (local_190 != &local_180) {
                operator_delete(local_190,local_180 + 1);
              }
              if (local_160 != &local_150) {
                operator_delete(local_160,CONCAT44(uStack_14c,local_150) + 1);
              }
            }
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,"Duplicate feature ID: ","");
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,local_1b0,(long)local_1b0 + local_1a8);
            GrcErrorList::AddItem
                      (&g_errorList,true,0xc50,local_108,(GrpLineAndFile *)0x0,&local_e0,&local_a0,
                       (string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0,
                       (string *)0x0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
            }
            if (local_1b0 != &local_1a0) {
              operator_delete(local_1b0,local_1a0 + 1);
            }
          }
          if (0xffff < local_1dc) {
            *local_110 = 0x20000;
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (ulong)((long)local_1d8.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_1d8.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      pGVar2 = local_168;
      bVar15 = GdlFeatureDefn::ErrorCheck(local_168);
      if (bVar15) {
        GdlFeatureDefn::SortFeatIDs(pGVar2);
        GdlFeatureDefn::SortFeatSettings(pGVar2);
        GdlFeatureDefn::SetStdStyleFlag(pGVar2);
        GdlFeatureDefn::FillInBoolean(pGVar2,local_120->m_psymtbl);
        GdlFeatureDefn::ErrorCheckContd(pGVar2);
        GdlFeatureDefn::CalculateDefault(pGVar2);
        pGVar2->m_nInternalID = (int)local_1b8;
        GdlFeatureDefn::RecordDebugInfo(pGVar2);
        local_1b8 = (ulong)(uint)((int)local_1b8 +
                                 (int)((ulong)((long)local_1d8.
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_1d8.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2));
      }
      if (local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar13 = local_118 + 1;
      ppGVar6 = (local_170->m_vpfeat).
                super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar14 = (long)(local_170->m_vpfeat).
                     super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)ppGVar6 >> 3;
    } while (uVar13 < uVar14);
  }
  if (0x40 < uVar14) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"Number of features (","");
    uVar14 = (long)(local_170->m_vpfeat).
                   super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(local_170->m_vpfeat).
                   super__Vector_base<GdlFeatureDefn_*,_std::allocator<GdlFeatureDefn_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    cVar5 = '\x01';
    if (9 < uVar14) {
      uVar13 = uVar14;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar13 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_00135598;
        }
        if (uVar13 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_00135598;
        }
        if (uVar13 < 10000) goto LAB_00135598;
        bVar15 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar15);
      cVar5 = cVar5 + '\x01';
    }
LAB_00135598:
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_100,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_100._M_dataplus._M_p,(uint)local_100._M_string_length,uVar14);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,") exceeds maximum of ","");
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_c0,'\x02');
    pcVar3 = local_c0._M_dataplus._M_p;
    pcVar3[0] = '6';
    pcVar3[1] = '4';
    GrcErrorList::AddItem
              (&g_errorList,true,0xc51,(GdlObject *)0x0,(GrpLineAndFile *)0x0,&local_140,&local_100,
               &local_80,&local_c0,(string *)0x0,(string *)0x0,(string *)0x0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_60);
  return true;
}

Assistant:

bool GdlRenderer::PreCompileFeatures(GrcManager * pcman, GrcFont * /*pfont*/, uint32_t * pfxdFeatVersion)
{
	*pfxdFeatVersion = 0x00010000;

	int nInternalID = 0;

	std::set<unsigned int> setID;

	for (size_t ipfeat = 0; ipfeat < m_vpfeat.size(); ipfeat++)
	{
		GdlFeatureDefn * pfeat = m_vpfeat[ipfeat];
		std::vector<unsigned int> vnIDs;
		pfeat->AltIDs(vnIDs);
		for (size_t iID = 0; iID < vnIDs.size(); iID++)
		{
			unsigned int nID = vnIDs[iID];
			if (setID.find(nID) != setID.end()) // is a member
			{
				auto stnID = nID > 0x00FFFFFF 
					? '\'' +std::string{char(nID >> 24), char(nID >> 16), char(nID >> 8), char(nID)} + '\''
					: std::to_string(nID);
				g_errorList.AddError(3152, pfeat, "Duplicate feature ID: ", stnID);
			}
			else
				setID.insert(nID);

			if (nID > 0x0000FFFF)
				*pfxdFeatVersion = 0x00020000;
		}

		if (pfeat->ErrorCheck())
		{
			pfeat->SortFeatIDs();
			pfeat->SortFeatSettings();
			pfeat->SetStdStyleFlag();
			pfeat->FillInBoolean(pcman->SymbolTable());
			pfeat->ErrorCheckContd();
			pfeat->CalculateDefault();
			pfeat->AssignInternalID(nInternalID); 
			pfeat->RecordDebugInfo();

			nInternalID += int(vnIDs.size());  // each alternate ID has its own internal ID
		}
	}

	if (m_vpfeat.size() > kMaxFeatures)
	{
		g_errorList.AddError(3153, NULL,
			"Number of features (",
			std::to_string(m_vpfeat.size()),
			") exceeds maximum of ",
			std::to_string(kMaxFeatures));
	}

	return true;
}